

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O0

void __thiscall QToolButton::setMenu(QToolButton *this,QMenu *menu)

{
  bool bVar1;
  QToolButtonPrivate *pQVar2;
  QWidget *this_00;
  long in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QToolButtonPrivate *d;
  QWidget *this_01;
  QSize local_18;
  QAction *action;
  
  action = *(QAction **)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QToolButton *)0x70b16f);
  this_01 = (QWidget *)&pQVar2->menuAction;
  if (in_RSI == 0) {
    this_00 = (QWidget *)0x0;
  }
  else {
    this_00 = (QWidget *)QMenu::menuAction((QMenu *)0x70b196);
  }
  bVar1 = ::operator==((QPointer<QAction> *)in_RDI,(QAction **)this_00);
  if (!bVar1) {
    bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QAction> *)0x70b1d8);
    if (bVar1) {
      ::QPointer::operator_cast_to_QAction_((QPointer<QAction> *)0x70b1ef);
      QWidget::removeAction(this_01,action);
    }
    if (in_RSI == 0) {
      QPointer<QAction>::operator=((QPointer<QAction> *)in_RDI,(QAction *)this_00);
    }
    else {
      QMenu::menuAction((QMenu *)0x70b20e);
      QPointer<QAction>::operator=((QPointer<QAction> *)in_RDI,(QAction *)this_00);
      ::QPointer::operator_cast_to_QAction_((QPointer<QAction> *)0x70b233);
      QWidget::addAction(in_RDI,(QAction *)this_00);
    }
    QSize::QSize((QSize *)in_RDI);
    (pQVar2->super_QAbstractButtonPrivate).sizeHint = local_18;
    QWidget::updateGeometry(in_RDI);
    QWidget::update(this_00);
  }
  if (*(QAction **)(in_FS_OFFSET + 0x28) != action) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QToolButton::setMenu(QMenu* menu)
{
    Q_D(QToolButton);

    if (d->menuAction == (menu ? menu->menuAction() : nullptr))
        return;

    if (d->menuAction)
        removeAction(d->menuAction);

    if (menu) {
        d->menuAction = menu->menuAction();
        addAction(d->menuAction);
    } else {
        d->menuAction = nullptr;
    }

    // changing the menu set may change the size hint, so reset it
    d->sizeHint = QSize();
    updateGeometry();
    update();
}